

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# context.cpp
# Opt level: O0

void __thiscall
Context::Context(Context *this,string *logfile_name,int float_precision,
                float float_comparison_tolerance,bool is_quiet_mode)

{
  bool bVar1;
  byte in_CL;
  undefined4 in_EDX;
  _Ios_Openmode in_ESI;
  string *in_RDI;
  undefined4 in_XMM0_Da;
  char *in_stack_ffffffffffffff98;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffffa0;
  
  std::ofstream::ofstream(in_RDI);
  *(undefined4 *)(in_RDI + 0x200) = in_EDX;
  *(undefined4 *)(in_RDI + 0x204) = in_XMM0_Da;
  in_RDI[0x208] = (string)(in_CL & 1);
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<Instance>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<Instance>_>_>_>
  ::map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<Instance>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<Instance>_>_>_>
         *)0x1a3de1);
  bVar1 = std::operator!=(in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98);
  if (bVar1) {
    std::operator|(_S_out,_S_app);
    std::ofstream::open(in_RDI,in_ESI);
  }
  return;
}

Assistant:

Context::Context(const std::string& logfile_name, int float_precision, float float_comparison_tolerance,
                 bool is_quiet_mode) : _float_precision(float_precision),
                                       _float_comparison_tolerance(float_comparison_tolerance),
                                       _is_quiet_mode(is_quiet_mode) {
    if (logfile_name != "")
        _logfile.open(logfile_name, std::ios::out | std::ios::app);
}